

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::StreamingReporterBase::~StreamingReporterBase(StreamingReporterBase *this)

{
  Ptr<Catch::IConfig> *in_RDI;
  vector<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_> *unaff_retaddr;
  
  in_RDI->m_p = (IConfig *)&PTR__StreamingReporterBase_002c2020;
  std::vector<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>::~vector(unaff_retaddr);
  LazyStat<Catch::TestCaseInfo>::~LazyStat((LazyStat<Catch::TestCaseInfo> *)0x20e03e);
  LazyStat<Catch::GroupInfo>::~LazyStat((LazyStat<Catch::GroupInfo> *)0x20e04c);
  LazyStat<Catch::TestRunInfo>::~LazyStat((LazyStat<Catch::TestRunInfo> *)0x20e05a);
  Ptr<Catch::IConfig>::~Ptr(in_RDI);
  SharedImpl<Catch::IStreamingReporter>::~SharedImpl
            ((SharedImpl<Catch::IStreamingReporter> *)0x20e072);
  return;
}

Assistant:

StreamingReporterBase::~StreamingReporterBase() {}